

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

InternalParseResult * __thiscall
Catch::clara::detail::Arg::parse(Arg *this,string *param_2,TokenStream *tokens)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  element_type *peVar4;
  BasicResult<Catch::clara::detail::ParseResultType> *other;
  Token *pTVar5;
  long *in_RSI;
  BasicResult<Catch::clara::detail::ParseState> *in_RDI;
  ParserResult result;
  BoundValueRefBase *valueRef;
  Token *token;
  TokenStream remainingTokens;
  Result validationResult;
  undefined4 in_stack_fffffffffffffe78;
  ParseResultType in_stack_fffffffffffffe7c;
  ParseState *in_stack_fffffffffffffe80;
  TokenStream *in_stack_fffffffffffffe88;
  undefined7 in_stack_fffffffffffffe90;
  BasicResult<Catch::clara::detail::ParseState> *this_00;
  BasicResult local_120 [48];
  BasicResult<Catch::clara::detail::ParseResultType> *local_f0;
  int local_b8 [10];
  int *local_90;
  undefined4 local_60;
  BasicResult local_50 [80];
  
  this_00 = in_RDI;
  (**(code **)(*in_RSI + 0x10))(local_50);
  bVar1 = BasicResult::operator_cast_to_bool(local_50);
  if (bVar1) {
    TokenStream::TokenStream
              ((TokenStream *)in_stack_fffffffffffffe80,
               (TokenStream *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    TokenStream::operator*(in_stack_fffffffffffffe88);
    local_90 = local_b8;
    if (local_b8[0] == 1) {
      peVar4 = std::
               __shared_ptr_access<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x34b74f);
      iVar3 = (*peVar4->_vptr_BoundRef[3])();
      bVar2 = (byte)iVar3;
      if (((bVar2 ^ 0xff) & 1) == 0) {
        __assert_fail("!m_ref->isFlag()",
                      "/workspace/llm4binary/github/license_c_cmakelists/philipp-classen[P]CppQuickCheck/test/catch.hpp"
                      ,0x248a,
                      "virtual InternalParseResult Catch::clara::detail::Arg::parse(const std::string &, const TokenStream &) const"
                     );
      }
      other = (BasicResult<Catch::clara::detail::ParseResultType> *)
              std::__shared_ptr<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>::get
                        ((__shared_ptr<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2> *
                         )(in_RSI + 2));
      local_f0 = other;
      pTVar5 = TokenStream::operator->((TokenStream *)in_stack_fffffffffffffe80);
      (*(other->super_ResultValueBase<Catch::clara::detail::ParseResultType>).super_ResultBase.
        _vptr_ResultBase[4])(local_120,other,&pTVar5->token);
      bVar1 = BasicResult::operator_cast_to_bool(local_120);
      if (bVar1) {
        in_stack_fffffffffffffe80 = (ParseState *)TokenStream::operator++((TokenStream *)this_00);
        ParseState::ParseState
                  (in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,(TokenStream *)0x34b844);
        BasicResult<Catch::clara::detail::ParseState>::ok<Catch::clara::detail::ParseState>
                  ((ParseState *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        ParseState::~ParseState((ParseState *)0x34b861);
      }
      else {
        BasicResult<Catch::clara::detail::ParseState>::
        BasicResult<Catch::clara::detail::ParseResultType>
                  ((BasicResult<Catch::clara::detail::ParseState> *)
                   CONCAT17(bVar2,in_stack_fffffffffffffe90),other);
      }
      local_60 = 1;
      BasicResult<Catch::clara::detail::ParseResultType>::~BasicResult
                ((BasicResult<Catch::clara::detail::ParseResultType> *)in_stack_fffffffffffffe80);
    }
    else {
      ParseState::ParseState
                (in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,(TokenStream *)0x34b6b6);
      BasicResult<Catch::clara::detail::ParseState>::ok<Catch::clara::detail::ParseState>
                ((ParseState *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      ParseState::~ParseState((ParseState *)0x34b6d9);
      local_60 = 1;
    }
    Token::~Token((Token *)0x34b8b3);
    TokenStream::~TokenStream((TokenStream *)0x34b8c0);
  }
  else {
    BasicResult<Catch::clara::detail::ParseState>::BasicResult<void>
              (this_00,(BasicResult<void> *)in_RDI);
    local_60 = 1;
  }
  BasicResult<void>::~BasicResult((BasicResult<void> *)in_stack_fffffffffffffe80);
  return this_00;
}

Assistant:

auto parse( std::string const &, TokenStream const &tokens ) const -> InternalParseResult override {
            auto validationResult = validate();
            if( !validationResult )
                return InternalParseResult( validationResult );

            auto remainingTokens = tokens;
            auto const &token = *remainingTokens;
            if( token.type != TokenType::Argument )
                return InternalParseResult::ok( ParseState( ParseResultType::NoMatch, remainingTokens ) );

            assert( !m_ref->isFlag() );
            auto valueRef = static_cast<detail::BoundValueRefBase*>( m_ref.get() );

            auto result = valueRef->setValue( remainingTokens->token );
            if( !result )
                return InternalParseResult( result );
            else
                return InternalParseResult::ok( ParseState( ParseResultType::Matched, ++remainingTokens ) );
        }